

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p3ch18ex2.cpp
# Opt level: O0

char * strdup(char *__s)

{
  undefined1 *local_28;
  char *s;
  size_t size;
  char *str_local;
  
  if (__s == (char *)0x0) {
    str_local = (char *)0x0;
  }
  else {
    s = (char *)0x0;
    for (size = (size_t)__s; *(char *)size != '\0'; size = size + 1) {
      s = s + 1;
    }
    local_28 = (undefined1 *)operator_new__((ulong)(s + 1));
    size = size - (long)s;
    while (*(char *)size != '\0') {
      *local_28 = *(undefined1 *)size;
      local_28 = local_28 + 1;
      size = size + 1;
    }
    *local_28 = 0;
    str_local = local_28 + -(long)s;
  }
  return str_local;
}

Assistant:

char *strdup(const char *str) {
  // check for nullptr
  if (!str) {
    return nullptr;
  }
  // get size of C string
  size_t size = 0;
  while (*str) {
    size++;
    str++;
  }
  // + 1 here to add space for \0 character
  char *s = new char[size + 1];
  // move pointer to the start of the string
  str -= size;
  while (*str) {
    *s++ = *str++;
  }
  // add terminating character
  *s = '\0';
  // move pointer to the start of the string
  s -= size;
  return s;
}